

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

Vec3 cross(Vec3 a,Vec3 b)

{
  Vec3 VVar1;
  undefined4 local_40;
  undefined4 uStack_3c;
  Vec3 b_local;
  undefined4 local_20;
  undefined4 uStack_1c;
  Vec3 a_local;
  
  uStack_3c = b.y;
  uStack_1c = a.y;
  local_20 = a.x;
  local_40 = b.x;
  VVar1.y = a.z * local_40 - local_20 * b.z;
  VVar1.x = uStack_1c * b.z - a.z * uStack_3c;
  VVar1.z = local_20 * uStack_3c - uStack_1c * local_40;
  return VVar1;
}

Assistant:

static inline Vec3 cross(Vec3 a, Vec3 b) {
    return (Vec3) {
        a.y * b.z - a.z * b.y,
            a.z * b.x - a.x * b.z,
            a.x * b.y - a.y * b.x,
            };
}